

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O1

TLVReader * __thiscall
ASDCP::MXF::TLVReader::ReadUi64(TLVReader *this,MDDEntry *Entry,ui64_t *value)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  ulong *in_RCX;
  undefined1 *puVar4;
  
  if (in_RCX == (ulong *)0x0) {
    puVar4 = Kumu::RESULT_PTR;
  }
  else {
    bVar3 = FindTL((TLVReader *)Entry,(MDDEntry *)value);
    if (bVar3) {
      uVar1 = *(uint *)(Entry->ul + 0xc);
      if ((ulong)*(uint *)(Entry->ul + 8) < (ulong)uVar1 + 8) {
        Kumu::Result_t::operator()((int *)this,Kumu::RESULT_FALSE);
        return this;
      }
      uVar2 = *(ulong *)(*(long *)Entry->ul + (ulong)uVar1);
      *in_RCX = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
                uVar2 << 0x38;
      *(uint *)(Entry->ul + 0xc) = uVar1 + 8;
      puVar4 = (undefined1 *)&Kumu::RESULT_OK;
    }
    else {
      puVar4 = Kumu::RESULT_FALSE;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar4);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::TLVReader::ReadUi64(const MDDEntry& Entry, ui64_t* value)
{
  ASDCP_TEST_NULL(value);

  if ( FindTL(Entry) )
    return MemIOReader::ReadUi64BE(value) ? RESULT_OK : RESULT_FALSE(__LINE__, __FILE__);

  return RESULT_FALSE;
}